

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O0

DynamicObject * __thiscall
Js::LazyJSONString::ReconstructObject(LazyJSONString *this,JSONObject *valueList)

{
  JavascriptString *obj_00;
  code *pcVar1;
  undefined8 this_00;
  JSONObjectProperty *this_01;
  NodeBase *pNVar2;
  bool bVar3;
  uint uVar4;
  PropertyId propertyId;
  JavascriptLibrary *this_02;
  undefined4 *puVar5;
  SListNodeBase<Memory::Recycler> **ppSVar6;
  Type *this_03;
  Var propertyValue_00;
  JavascriptString **ppJVar7;
  ScriptContext *pSVar8;
  PropertyString *local_e8;
  PropertyRecord *local_c8;
  PropertyRecord *localPropertyRecord;
  PropertyValueInfo info;
  PropertyString *propertyString;
  JavascriptString *propertyName;
  Var propertyValue;
  JSONObjectProperty *entry;
  Iterator __iter;
  DynamicObject *obj;
  PropertyIndex requestedInlineSlotCapacity;
  uint elementCount;
  JSONObject *valueList_local;
  LazyJSONString *this_local;
  SListNodeBase<Memory::Recycler> local_28;
  JSONObjectProperty **local_20;
  bool local_11;
  JavascriptString *local_10;
  
  uVar4 = RealCount::Count(&(valueList->
                            super_SList<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>).
                            super_SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>.
                            super_RealCount);
  this_02 = RecyclableObject::GetLibrary((RecyclableObject *)this);
  __iter.current = (NodeBase *)JavascriptLibrary::CreateObject(this_02,true,(PropertyIndex)uVar4);
  _entry = SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::GetIterator
                     ((SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)valueList);
LAB_0134d447:
  local_20 = &entry;
  if (__iter.list == (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_01 = entry;
  SListNodeBase<Memory::Recycler>::Next(&local_28);
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__((WriteBarrierPtr *)&local_28);
  bVar3 = SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::IsHead
                    ((SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)this_01,
                     *ppSVar6);
  if (!bVar3) {
    SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)&this_local);
    Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__((WriteBarrierPtr *)&this_local);
  }
  local_11 = !bVar3;
  if (!local_11) {
    return (DynamicObject *)__iter.current;
  }
  this_03 = SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Iterator::Data
                      ((Iterator *)&entry);
  propertyValue_00 = ReconstructVar(this,&this_03->propertyValue);
  ppJVar7 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__((WriteBarrierPtr *)this_03)
  ;
  obj_00 = *ppJVar7;
  local_10 = obj_00;
  bVar3 = VarIs<Js::PropertyString,Js::JavascriptString>(obj_00);
  if (bVar3) {
    local_e8 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>(local_10);
  }
  else {
    local_e8 = (PropertyString *)0x0;
  }
  info._56_8_ = local_e8;
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&localPropertyRecord);
  pNVar2 = __iter.current;
  this_00 = info._56_8_;
  if (info._56_8_ != 0) goto code_r0x0134d5e1;
  goto LAB_0134d63d;
code_r0x0134d5e1:
  pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  bVar3 = PropertyString::TrySetPropertyFromCache
                    ((PropertyString *)this_00,(RecyclableObject *)pNVar2,propertyValue_00,pSVar8,
                     PropertyOperation_None,(PropertyValueInfo *)&localPropertyRecord);
  if (!bVar3) {
LAB_0134d63d:
    (*(obj_00->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x61])(obj_00,&local_c8,0);
    pNVar2 = __iter.current;
    propertyId = PropertyRecord::GetPropertyId(local_c8);
    pSVar8 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    Js::JavascriptOperators::SetProperty
              (pNVar2,(RecyclableObject *)pNVar2,propertyId,propertyValue_00,
               (PropertyValueInfo *)&localPropertyRecord,pSVar8,PropertyOperation_None);
  }
  goto LAB_0134d447;
}

Assistant:

DynamicObject*
LazyJSONString::ReconstructObject(_In_ JSONObject* valueList) const
{
    const uint elementCount = valueList->Count();

    // This is just a heuristic, so overflow doesn't matter
    PropertyIndex requestedInlineSlotCapacity = static_cast<PropertyIndex>(elementCount);

    DynamicObject* obj = this->GetLibrary()->CreateObject(
        true, // allowObjectHeaderInlining
        requestedInlineSlotCapacity);

    FOREACH_SLISTCOUNTED_ENTRY(JSONObjectProperty, entry, valueList)
    {
        Var propertyValue = ReconstructVar(&entry.propertyValue);
        JavascriptString* propertyName = entry.propertyName;
        PropertyString* propertyString = JavascriptOperators::TryFromVar<PropertyString>(propertyName);
        PropertyValueInfo info;
        if (!propertyString || !propertyString->TrySetPropertyFromCache(obj, propertyValue, this->GetScriptContext(), PropertyOperation_None, &info))
        {
            Js::PropertyRecord const * localPropertyRecord;
            propertyName->GetPropertyRecord(&localPropertyRecord);
            JavascriptOperators::SetProperty(obj, obj, localPropertyRecord->GetPropertyId(),
                propertyValue, &info, this->GetScriptContext());
        }
    }
    NEXT_SLISTCOUNTED_ENTRY;
    return obj;
}